

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

double __thiscall Model::specular(Model *this,vec2f *uvf)

{
  TGAColor TVar1;
  TGAImage *this_00;
  size_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  TGAColor local_1d;
  vec2f *local_18;
  vec2f *uvf_local;
  Model *this_local;
  
  this_00 = &this->specularmap_;
  local_18 = uvf;
  uvf_local = (vec2f *)this;
  dVar6 = vec<2UL,_double>::operator[](uvf,0);
  sVar2 = TGAImage::get_width(this_00);
  auVar8._8_4_ = (int)(sVar2 >> 0x20);
  auVar8._0_8_ = sVar2;
  auVar8._12_4_ = 0x45300000;
  dVar6 = dVar6 * ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  uVar3 = (ulong)dVar6;
  dVar7 = vec<2UL,_double>::operator[](local_18,1);
  sVar2 = TGAImage::get_height(this_00);
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  dVar7 = dVar7 * ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  uVar5 = (ulong)dVar7;
  TVar1 = TGAImage::get(this_00,uVar3 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f,
                        uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f);
  local_1d.bgra = TVar1.bgra;
  local_1d.bytespp = TVar1.bytespp;
  pbVar4 = TGAColor::operator[](&local_1d,0);
  return (double)*pbVar4;
}

Assistant:

double Model::specular(const vec2f &uvf) const
{
    return specularmap_.get(static_cast<size_t>(uvf[0] * specularmap_.get_width()),
                            static_cast<size_t>(uvf[1] * specularmap_.get_height()))[0];
}